

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O3

WallTimeImp * benchmark::walltime::anon_unknown_1::WallTimeImp::GetWallTimeImp(void)

{
  int iVar1;
  WallTimeImp *this;
  
  if ((anonymous_namespace)::WallTimeImp::GetWallTimeImp()::imp == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::WallTimeImp::GetWallTimeImp()::imp);
    if (iVar1 != 0) {
      this = (WallTimeImp *)operator_new(0x30);
      WallTimeImp(this);
      GetWallTimeImp::imp = this;
      __cxa_guard_release(&(anonymous_namespace)::WallTimeImp::GetWallTimeImp()::imp);
    }
  }
  return GetWallTimeImp::imp;
}

Assistant:

static WallTimeImp& GetWallTimeImp() {
    static WallTimeImp* imp = new WallTimeImp();
    return *imp;
  }